

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void __thiscall
duckdb::Linenoise::AddErrorHighlighting
          (Linenoise *this,idx_t render_start,idx_t render_end,
          vector<duckdb::highlightToken,_true> *tokens)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  void *__s1;
  void *__s2;
  size_t __n;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  ulong uVar9;
  value_type *pvVar10;
  reference pvVar11;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  highlightToken comment_token;
  bool inserted_comment;
  size_t c_end;
  value_type c_start;
  idx_t c_1;
  idx_t token_idx;
  vector<duckdb::highlightToken,_true> new_tokens;
  idx_t render_position;
  unsigned_long *bracket_position;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_true> *__range1_1;
  unsigned_long render_error;
  unsigned_long *error;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_true> *__range1;
  idx_t end;
  idx_t start;
  idx_t marker_start;
  idx_t idx;
  idx_t next_dollar;
  char c;
  idx_t i;
  idx_t quote_pos;
  string dollar_quote_marker;
  vector<unsigned_long,_true> comment_end;
  vector<unsigned_long,_true> comment_start;
  vector<unsigned_long,_true> cursor_brackets;
  vector<unsigned_long,_true> errors;
  vector<unsigned_long,_true> curly_brackets;
  vector<unsigned_long,_true> square_brackets;
  vector<unsigned_long,_true> brackets;
  ScanState state;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc88;
  reference in_stack_fffffffffffffc90;
  value_type *in_stack_fffffffffffffc98;
  value_type *pvVar12;
  reference in_stack_fffffffffffffca0;
  vector<unsigned_long,_true> *in_stack_fffffffffffffca8;
  vector<unsigned_long,_true> *in_stack_fffffffffffffcb0;
  size_type in_stack_fffffffffffffcb8;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_fffffffffffffcc0
  ;
  ulong local_330;
  tokenType local_2a0;
  ulong local_298;
  bool in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd71;
  undefined6 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7e;
  byte bVar13;
  allocator in_stack_fffffffffffffd7f;
  string local_280 [7];
  tokenType in_stack_fffffffffffffd87;
  ulong local_250;
  value_type *local_248;
  allocator local_219;
  string local_218;
  unsigned_long *local_1f8;
  unsigned_long *local_1f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e0;
  long local_1d8;
  allocator local_1c9;
  string local_1c8;
  unsigned_long *local_1a8;
  unsigned_long *local_1a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_198;
  undefined1 *local_190;
  string local_188 [32];
  ulong local_168;
  ulong local_160;
  allocator local_151;
  string local_150 [32];
  long local_130;
  ulong local_128;
  ulong local_120;
  char local_101;
  ulong local_100;
  ulong local_f8;
  string local_f0 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  undefined1 local_88 [100];
  int local_24;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *local_20;
  ulong local_18;
  ulong local_10;
  
  if (((enableErrorRendering & 1) != 0) && (*(ulong *)(in_RDI + 0x38) < 2000)) {
    local_24 = 0;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202cd4);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202ce1);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202cee);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202cfb);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202d08);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202d15);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x202d22);
    ::std::__cxx11::string::string(local_f0);
    local_f8 = 0;
    for (local_100 = 0; uVar8 = local_100, local_100 < *(ulong *)(in_RDI + 0x38);
        local_100 = local_100 + 1) {
      local_101 = *(char *)(*(long *)(in_RDI + 8) + local_100);
      switch(local_24) {
      case 0:
        switch(local_101) {
        case '\"':
          local_24 = 2;
          local_f8 = local_100;
          break;
        default:
          break;
        case '$':
          if (local_100 + 1 < *(ulong *)(in_RDI + 0x38)) {
            local_120 = 0;
            local_128 = local_100;
            while (local_128 = local_128 + 1, local_128 < *(ulong *)(in_RDI + 0x38)) {
              if (*(char *)(*(long *)(in_RDI + 8) + local_128) == '$') {
                local_120 = local_128;
                break;
              }
              if (((((*(char *)(*(long *)(in_RDI + 8) + local_128) < 'A') ||
                    ('Z' < *(char *)(*(long *)(in_RDI + 8) + local_128))) &&
                   ((*(char *)(*(long *)(in_RDI + 8) + local_128) < 'a' ||
                    ('z' < *(char *)(*(long *)(in_RDI + 8) + local_128))))) &&
                  ((*(char *)(*(long *)(in_RDI + 8) + local_128) < -0x80 ||
                   ((uint)(int)*(char *)(*(long *)(in_RDI + 8) + local_128) < 0x80000000)))) &&
                 ((local_128 <= local_100 + 1 ||
                  ((*(char *)(*(long *)(in_RDI + 8) + local_128) < '0' ||
                   ('9' < *(char *)(*(long *)(in_RDI + 8) + local_128))))))) break;
            }
            if (local_120 != 0) {
              local_24 = 4;
              local_f8 = local_100;
              local_100 = local_120;
              if (local_120 < *(ulong *)(in_RDI + 0x38)) {
                local_130 = uVar8 + 1;
                pcVar3 = (char *)(*(long *)(in_RDI + 8) + local_130);
                uVar8 = local_120 - local_130;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string(local_150,pcVar3,uVar8,&local_151);
                ::std::__cxx11::string::operator=(local_f0,local_150);
                ::std::__cxx11::string::~string(local_150);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_151);
              }
            }
          }
          break;
        case '\'':
          local_24 = 1;
          local_f8 = local_100;
          break;
        case '(':
          OpenBracket((vector<unsigned_long,_true> *)in_stack_fffffffffffffca0,
                      (vector<unsigned_long,_true> *)in_stack_fffffffffffffc98,
                      (idx_t)in_stack_fffffffffffffc90,(idx_t)in_stack_fffffffffffffc88);
          break;
        case ')':
          CloseBracket(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       (idx_t)in_stack_fffffffffffffca0,(idx_t)in_stack_fffffffffffffc98,
                       (vector<unsigned_long,_true> *)in_stack_fffffffffffffc90);
          break;
        case '-':
          if ((local_100 + 1 < *(ulong *)(in_RDI + 0x38)) &&
             (*(char *)(*(long *)(in_RDI + 8) + 1 + local_100) == '-')) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffca0,(value_type_conflict1 *)in_stack_fffffffffffffc98);
            local_100 = local_100 + 1;
            local_24 = 3;
          }
          break;
        case '[':
          OpenBracket((vector<unsigned_long,_true> *)in_stack_fffffffffffffca0,
                      (vector<unsigned_long,_true> *)in_stack_fffffffffffffc98,
                      (idx_t)in_stack_fffffffffffffc90,(idx_t)in_stack_fffffffffffffc88);
          break;
        case ']':
          CloseBracket(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       (idx_t)in_stack_fffffffffffffca0,(idx_t)in_stack_fffffffffffffc98,
                       (vector<unsigned_long,_true> *)in_stack_fffffffffffffc90);
          break;
        case '{':
          OpenBracket((vector<unsigned_long,_true> *)in_stack_fffffffffffffca0,
                      (vector<unsigned_long,_true> *)in_stack_fffffffffffffc98,
                      (idx_t)in_stack_fffffffffffffc90,(idx_t)in_stack_fffffffffffffc88);
          break;
        case '}':
          CloseBracket(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       (idx_t)in_stack_fffffffffffffca0,(idx_t)in_stack_fffffffffffffc98,
                       (vector<unsigned_long,_true> *)in_stack_fffffffffffffc90);
        }
        break;
      case 1:
        if (local_101 == '\'') {
          if ((local_100 + 1 < *(ulong *)(in_RDI + 0x38)) &&
             (*(char *)(*(long *)(in_RDI + 8) + 1 + local_100) == '\'')) {
            local_100 = local_100 + 1;
          }
          else {
            local_24 = 0;
          }
        }
        break;
      case 2:
        if (local_101 == '\"') {
          if ((local_100 + 1 < *(ulong *)(in_RDI + 0x38)) &&
             (*(char *)(*(long *)(in_RDI + 8) + 1 + local_100) == '\"')) {
            local_100 = local_100 + 1;
          }
          else {
            local_24 = 0;
          }
        }
        break;
      case 3:
        if ((local_101 == '\n') || (local_101 == '\r')) {
          local_24 = 0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffca0,(value_type_conflict1 *)in_stack_fffffffffffffc98);
        }
        break;
      case 4:
        if ((local_101 == '$') && (local_100 + 1 < *(ulong *)(in_RDI + 0x38))) {
          local_160 = local_100 + 1;
          local_168 = local_160;
          while( true ) {
            bVar1 = false;
            if (local_168 < *(ulong *)(in_RDI + 0x38)) {
              bVar1 = *(char *)(*(long *)(in_RDI + 8) + local_168) != '$';
            }
            if (!bVar1) break;
            local_168 = local_168 + 1;
          }
          if ((local_168 < *(ulong *)(in_RDI + 0x38)) &&
             (lVar4 = local_168 - local_160, lVar5 = ::std::__cxx11::string::size(), lVar4 == lVar5)
             ) {
            __s1 = (void *)(*(long *)(in_RDI + 8) + local_160);
            __s2 = (void *)::std::__cxx11::string::c_str();
            __n = ::std::__cxx11::string::size();
            iVar2 = memcmp(__s1,__s2,__n);
            if (iVar2 == 0) {
              ::std::__cxx11::string::string(local_188);
              ::std::__cxx11::string::operator=(local_f0,local_188);
              ::std::__cxx11::string::~string(local_188);
              local_24 = 0;
              local_100 = local_168;
            }
          }
        }
      }
    }
    if (((local_24 == 2) || (local_24 == 1)) || (local_24 == 4)) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0,
                 (value_type_conflict1 *)in_stack_fffffffffffffc98);
    }
    HandleBracketErrors(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    HandleBracketErrors(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    HandleBracketErrors(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    local_190 = local_88;
    local_198._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffc88);
    local_1a0 = (unsigned_long *)
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          (in_stack_fffffffffffffc88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffc90,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffc88), bVar1) {
      local_1a8 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_198);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"Error found at position %llu\n",&local_1c9);
      Log<unsigned_long>(&local_1c8,*local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      if ((local_10 <= *local_1a8) && (*local_1a8 <= local_18)) {
        local_1d8 = *local_1a8 - local_10;
        InsertToken(in_stack_fffffffffffffd87,
                    CONCAT17(in_stack_fffffffffffffd7f,
                             CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)),
                    (vector<duckdb::highlightToken,_true> *)
                    CONCAT71(in_stack_fffffffffffffd71,in_stack_fffffffffffffd70));
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_198);
    }
    sVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_a0);
    if (sVar6 != 2) {
      vector<unsigned_long,_true>::clear((vector<unsigned_long,_true> *)0x20381c);
    }
    local_1e0 = &local_a0;
    local_1e8._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffc88);
    local_1f0 = (unsigned_long *)
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          (in_stack_fffffffffffffc88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffc90,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffc88), bVar1) {
      local_1f8 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_1e8);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_218,"Highlight bracket at position %d\n",&local_219);
      Log<unsigned_long>(&local_218,*local_1f8);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if ((local_10 <= *local_1f8) && (*local_1f8 <= local_18)) {
        InsertToken(in_stack_fffffffffffffd87,
                    CONCAT17(in_stack_fffffffffffffd7f,
                             CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)),
                    (vector<duckdb::highlightToken,_true> *)
                    CONCAT71(in_stack_fffffffffffffd71,in_stack_fffffffffffffd70));
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1e8);
    }
    bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffca0);
    if (!bVar1) {
      vector<duckdb::highlightToken,_true>::vector((vector<duckdb::highlightToken,_true> *)0x2039d7)
      ;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size(local_20)
      ;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      local_248 = (value_type *)0x0;
      for (local_250 = 0;
          sVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_b8),
          local_250 < sVar6; local_250 = local_250 + 1) {
        pvVar7 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)in_stack_fffffffffffffc90,
                            (size_type)in_stack_fffffffffffffc88);
        uVar8 = *pvVar7;
        sVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_d0);
        if (local_250 < sVar6) {
          pvVar7 = vector<unsigned_long,_true>::operator[]
                             ((vector<unsigned_long,_true> *)in_stack_fffffffffffffc90,
                              (size_type)in_stack_fffffffffffffc88);
          local_330 = *pvVar7;
        }
        else {
          local_330 = *(ulong *)(in_RDI + 0x38);
        }
        if ((local_10 <= uVar8) && (local_330 <= local_18)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_280,"Comment at position %d to %d\n",
                     (allocator *)&stack0xfffffffffffffd7f);
          Log<unsigned_long,unsigned_long>((string *)local_280,uVar8,local_330);
          ::std::__cxx11::string::~string(local_280);
          ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd7f);
          uVar8 = uVar8 - local_10;
          uVar9 = local_330 - local_10;
          bVar13 = 0;
          highlightToken::highlightToken((highlightToken *)&local_2a0);
          local_2a0 = TOKEN_COMMENT;
          local_298 = uVar8;
          while (pvVar12 = local_248,
                pvVar10 = (value_type *)
                          ::std::
                          vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
                          size(local_20), pvVar12 < pvVar10) {
            pvVar11 = vector<duckdb::highlightToken,_true>::operator[]
                                ((vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffc90,
                                 (size_type)in_stack_fffffffffffffc88);
            if (uVar8 <= pvVar11->start) {
              ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
              push_back((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                        in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
              bVar13 = 1;
              break;
            }
            vector<duckdb::highlightToken,_true>::operator[]
                      ((vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffc90,
                       (size_type)in_stack_fffffffffffffc88);
            ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
            push_back((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                      in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
            local_248 = (value_type *)&local_248->field_0x1;
          }
          if ((bVar13 & 1) == 0) {
            ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
            push_back((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                      in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
          }
          else {
            while ((pvVar12 = local_248,
                   pvVar10 = (value_type *)
                             ::std::
                             vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ::size(local_20), pvVar12 < pvVar10 &&
                   (in_stack_fffffffffffffca0 =
                         vector<duckdb::highlightToken,_true>::operator[]
                                   ((vector<duckdb::highlightToken,_true> *)
                                    in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88),
                   in_stack_fffffffffffffca0->start <= uVar9))) {
              local_248 = (value_type *)&local_248->field_0x1;
            }
          }
        }
      }
      while (pvVar12 = local_248,
            pvVar10 = (value_type *)
                      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ::size(local_20), pvVar12 < pvVar10) {
        in_stack_fffffffffffffc90 =
             vector<duckdb::highlightToken,_true>::operator[]
                       ((vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffc90,
                        (size_type)in_stack_fffffffffffffc88);
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                   in_stack_fffffffffffffca0,pvVar12);
        local_248 = (value_type *)&local_248->field_0x1;
      }
      vector<duckdb::highlightToken,_true>::operator=
                ((vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffc90,
                 (vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffc88);
      vector<duckdb::highlightToken,_true>::~vector
                ((vector<duckdb::highlightToken,_true> *)0x203e3c);
    }
    ::std::__cxx11::string::~string(local_f0);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203e67);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203e74);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203e81);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203e8e);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203e9b);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203ea8);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x203eb5);
  }
  return;
}

Assistant:

void Linenoise::AddErrorHighlighting(idx_t render_start, idx_t render_end, vector<highlightToken> &tokens) const {
	static constexpr const idx_t MAX_ERROR_LENGTH = 2000;
	if (!enableErrorRendering) {
		return;
	}
	if (len >= MAX_ERROR_LENGTH) {
		return;
	}
	// do a pass over the buffer to collect errors:
	// * brackets without matching closing/opening bracket
	// * single quotes without matching closing single quote
	// * double quote without matching double quote
	ScanState state = ScanState::STANDARD;
	vector<idx_t> brackets;        // ()
	vector<idx_t> square_brackets; // []
	vector<idx_t> curly_brackets;  // {}
	vector<idx_t> errors;
	vector<idx_t> cursor_brackets;
	vector<idx_t> comment_start;
	vector<idx_t> comment_end;
	string dollar_quote_marker;
	idx_t quote_pos = 0;
	for (idx_t i = 0; i < len; i++) {
		auto c = buf[i];
		switch (state) {
		case ScanState::STANDARD:
			switch (c) {
			case '-':
				if (i + 1 < len && buf[i + 1] == '-') {
					// -- puts us in a comment
					comment_start.push_back(i);
					i++;
					state = ScanState::IN_COMMENT;
					break;
				}
				break;
			case '\'':
				state = ScanState::IN_SINGLE_QUOTE;
				quote_pos = i;
				break;
			case '\"':
				state = ScanState::IN_DOUBLE_QUOTE;
				quote_pos = i;
				break;
			case '(':
				OpenBracket(brackets, cursor_brackets, pos, i);
				break;
			case '[':
				OpenBracket(square_brackets, cursor_brackets, pos, i);
				break;
			case '{':
				OpenBracket(curly_brackets, cursor_brackets, pos, i);
				break;
			case ')':
				CloseBracket(brackets, cursor_brackets, pos, i, errors);
				break;
			case ']':
				CloseBracket(square_brackets, cursor_brackets, pos, i, errors);
				break;
			case '}':
				CloseBracket(curly_brackets, cursor_brackets, pos, i, errors);
				break;
			case '$': { // dollar symbol
				if (i + 1 >= len) {
					// we need more than just a dollar
					break;
				}
				// check if this is a dollar-quoted string
				idx_t next_dollar = 0;
				for (idx_t idx = i + 1; idx < len; idx++) {
					if (buf[idx] == '$') {
						// found the next dollar
						next_dollar = idx;
						break;
					}
					// all characters can be between A-Z, a-z or \200 - \377
					if (buf[idx] >= 'A' && buf[idx] <= 'Z') {
						continue;
					}
					if (buf[idx] >= 'a' && buf[idx] <= 'z') {
						continue;
					}
					if (buf[idx] >= '\200' && buf[idx] <= '\377') {
						continue;
					}
					// the first character CANNOT be a numeric, only subsequent characters
					if (idx > i + 1 && buf[idx] >= '0' && buf[idx] <= '9') {
						continue;
					}
					// not a dollar quoted string
					break;
				}
				if (next_dollar == 0) {
					// not a dollar quoted string
					break;
				}
				// dollar quoted string
				state = ScanState::DOLLAR_QUOTED_STRING;
				quote_pos = i;
				i = next_dollar;
				if (i < len) {
					// found a complete marker - store it
					idx_t marker_start = quote_pos + 1;
					dollar_quote_marker = string(buf + marker_start, i - marker_start);
				}
				break;
			}
			default:
				break;
			}
			break;
		case ScanState::IN_COMMENT:
			// comment state - the only thing that will get us out is a newline
			switch (c) {
			case '\r':
			case '\n':
				// newline - left comment state
				state = ScanState::STANDARD;
				comment_end.push_back(i);
				break;
			default:
				break;
			}
			break;
		case ScanState::IN_SINGLE_QUOTE:
			// single quote - all that will get us out is an unescaped single-quote
			if (c == '\'') {
				if (i + 1 < len && buf[i + 1] == '\'') {
					// double single-quote means the quote is escaped - continue
					i++;
					break;
				} else {
					// otherwise revert to standard scan state
					state = ScanState::STANDARD;
					break;
				}
			}
			break;
		case ScanState::IN_DOUBLE_QUOTE:
			// double quote - all that will get us out is an unescaped quote
			if (c == '"') {
				if (i + 1 < len && buf[i + 1] == '"') {
					// double quote means the quote is escaped - continue
					i++;
					break;
				} else {
					// otherwise revert to standard scan state
					state = ScanState::STANDARD;
					break;
				}
			}
			break;
		case ScanState::DOLLAR_QUOTED_STRING: {
			// dollar-quoted string - all that will get us out is a $[marker]$
			if (c != '$') {
				break;
			}
			if (i + 1 >= len) {
				// no room for the final dollar
				break;
			}
			// skip to the next dollar symbol
			idx_t start = i + 1;
			idx_t end = start;
			while (end < len && buf[end] != '$') {
				end++;
			}
			if (end >= len) {
				// no final dollar found - continue as normal
				break;
			}
			if (end - start != dollar_quote_marker.size()) {
				// length mismatch - cannot match
				break;
			}
			if (memcmp(buf + start, dollar_quote_marker.c_str(), dollar_quote_marker.size()) != 0) {
				// marker mismatch
				break;
			}
			// marker found! revert to standard state
			dollar_quote_marker = string();
			state = ScanState::STANDARD;
			i = end;
			break;
		}
		default:
			break;
		}
	}
	if (state == ScanState::IN_DOUBLE_QUOTE || state == ScanState::IN_SINGLE_QUOTE ||
	    state == ScanState::DOLLAR_QUOTED_STRING) {
		// quote is never closed
		errors.push_back(quote_pos);
	}
	HandleBracketErrors(brackets, errors);
	HandleBracketErrors(square_brackets, errors);
	HandleBracketErrors(curly_brackets, errors);

	// insert all the errors for highlighting
	for (auto &error : errors) {
		Linenoise::Log("Error found at position %llu\n", error);
		if (error < render_start || error > render_end) {
			continue;
		}
		auto render_error = error - render_start;
		InsertToken(tokenType::TOKEN_ERROR, render_error, tokens);
	}
	if (cursor_brackets.size() != 2) {
		// no matching cursor brackets found
		cursor_brackets.clear();
	}
	// insert bracket for highlighting
	for (auto &bracket_position : cursor_brackets) {
		Linenoise::Log("Highlight bracket at position %d\n", bracket_position);
		if (bracket_position < render_start || bracket_position > render_end) {
			continue;
		}

		idx_t render_position = bracket_position - render_start;
		InsertToken(tokenType::TOKEN_BRACKET, render_position, tokens);
	}
	// insert comments
	if (!comment_start.empty()) {
		vector<highlightToken> new_tokens;
		new_tokens.reserve(tokens.size());
		idx_t token_idx = 0;
		for (idx_t c = 0; c < comment_start.size(); c++) {
			auto c_start = comment_start[c];
			auto c_end = c < comment_end.size() ? comment_end[c] : len;
			if (c_start < render_start || c_end > render_end) {
				continue;
			}
			Linenoise::Log("Comment at position %d to %d\n", c_start, c_end);
			c_start -= render_start;
			c_end -= render_start;
			bool inserted_comment = false;

			highlightToken comment_token;
			comment_token.start = c_start;
			comment_token.type = tokenType::TOKEN_COMMENT;
			comment_token.search_match = false;

			for (; token_idx < tokens.size(); token_idx++) {
				if (tokens[token_idx].start >= c_start) {
					// insert the comment here
					new_tokens.push_back(comment_token);
					inserted_comment = true;
					break;
				}
				new_tokens.push_back(tokens[token_idx]);
			}
			if (!inserted_comment) {
				new_tokens.push_back(comment_token);
			} else {
				// skip all tokens until we exit the comment again
				for (; token_idx < tokens.size(); token_idx++) {
					if (tokens[token_idx].start > c_end) {
						break;
					}
				}
			}
		}
		for (; token_idx < tokens.size(); token_idx++) {
			new_tokens.push_back(tokens[token_idx]);
		}
		tokens = std::move(new_tokens);
	}
}